

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrandom.cpp
# Opt level: O2

quint64 __thiscall QRandomGenerator::_fillRange(QRandomGenerator *this,void *buffer,qptrdiff count)

{
  result_type rVar1;
  quint64 qVar2;
  undefined1 **ppuVar3;
  long lVar4;
  undefined1 **begin;
  long in_FS_OFFSET;
  PRNGLocker lock;
  quint64 dummy;
  PRNGLocker local_41;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  begin = (undefined1 **)buffer;
  if (buffer == (void *)0x0) {
    begin = &local_40;
  }
  if (this->type == 0) {
    SystemGenerator::generate
              ((SystemGenerator *)this,(quint32 *)begin,(quint32 *)((long)begin + count * 4));
  }
  else {
    local_41.locked = true;
    SystemAndGlobalGenerators::PRNGLocker::PRNGLocker(&local_41,this);
    for (lVar4 = 0; count * 4 - lVar4 != 0; lVar4 = lVar4 + 4) {
      rVar1 = std::
              mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
              ::operator()(&(this->storage).twister);
      *(result_type *)((long)begin + lVar4) = rVar1;
    }
    SystemAndGlobalGenerators::PRNGLocker::~PRNGLocker(&local_41);
  }
  qVar2 = (quint64)*(uint *)begin;
  if (count != 1) {
    ppuVar3 = &local_40;
    if (buffer != (void *)0x0) {
      ppuVar3 = (undefined1 **)buffer;
    }
    qVar2 = CONCAT44(*(undefined4 *)((long)ppuVar3 + 4),*(uint *)begin);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return qVar2;
  }
  __stack_chk_fail();
}

Assistant:

quint64 QRandomGenerator::_fillRange(void *buffer, qptrdiff count)
{
    // Verify that the pointers are properly aligned for 32-bit
    Q_ASSERT(quintptr(buffer) % sizeof(quint32) == 0);
    Q_ASSERT(count >= 0);
    Q_ASSERT(buffer || count <= 2);

    quint64 dummy;
    quint32 *begin = static_cast<quint32 *>(buffer ? buffer : &dummy);
    quint32 *end = begin + count;

    if (type == SystemRNG || Q_UNLIKELY(uint(qt_randomdevice_control.loadAcquire()) & (UseSystemRNG|SetRandomData))) {
        SystemGenerator::self().generate(begin, end);
    } else {
        SystemAndGlobalGenerators::PRNGLocker lock(this);
        std::generate(begin, end, [this]() { return storage.engine()(); });
    }

    if (end - begin == 1)
        return *begin;
    return begin[0] | (quint64(begin[1]) << 32);
}